

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void * __kmp_task_reduction_init<kmp_task_red_input>(int gtid,int num,kmp_task_red_input *data)

{
  int iVar1;
  kmp_taskgroup_t *pkVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int j;
  size_t size;
  int i;
  kmp_taskred_data_t *arr;
  kmp_int32 nth;
  kmp_taskgroup_t *tg;
  kmp_info_t *thread;
  char *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_3c;
  
  pkVar2 = ((__kmp_threads[in_EDI]->th).th_current_task)->td_taskgroup;
  iVar1 = (__kmp_threads[in_EDI]->th).th_team_nproc;
  if (pkVar2 == (kmp_taskgroup_t *)0x0) {
    __kmp_debug_assert(in_stack_00000050,(char *)CONCAT44(gtid,num),data._4_4_);
  }
  if (in_RDX == 0) {
    __kmp_debug_assert(in_stack_00000050,(char *)CONCAT44(gtid,num),data._4_4_);
  }
  if (in_ESI < 1) {
    __kmp_debug_assert(in_stack_00000050,(char *)CONCAT44(gtid,num),data._4_4_);
  }
  if (iVar1 != 1) {
    pvVar3 = ___kmp_thread_malloc
                       ((kmp_info_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
      uVar4 = *(long *)(in_RDX + (long)local_3c * 0x30 + 8) - 1;
      lVar5 = (0x40 - (uVar4 & 0x3f)) + uVar4;
      if (*(long *)(in_RDX + (long)local_3c * 0x30 + 0x20) == 0) {
        __kmp_debug_assert(in_stack_00000050,(char *)CONCAT44(gtid,num),data._4_4_);
      }
      *(undefined8 *)((long)pvVar3 + (long)local_3c * 0x48) =
           *(undefined8 *)(in_RDX + (long)local_3c * 0x30);
      *(long *)((long)pvVar3 + (long)local_3c * 0x48 + 8) = lVar5;
      *(undefined4 *)((long)pvVar3 + (long)local_3c * 0x48 + 0x10) =
           *(undefined4 *)(in_RDX + (long)local_3c * 0x30 + 0x28);
      *(undefined8 *)((long)pvVar3 + (long)local_3c * 0x48 + 0x28) =
           *(undefined8 *)(in_RDX + (long)local_3c * 0x30 + 0x20);
      *(undefined8 *)((long)pvVar3 + (long)local_3c * 0x48 + 0x30) =
           *(undefined8 *)(in_RDX + (long)local_3c * 0x30 + 0x10);
      *(undefined8 *)((long)pvVar3 + (long)local_3c * 0x48 + 0x38) =
           *(undefined8 *)(in_RDX + (long)local_3c * 0x30 + 0x18);
      __kmp_assign_orig<kmp_task_red_input>
                ((kmp_taskred_data_t *)((long)pvVar3 + (long)local_3c * 0x48),
                 (kmp_task_red_input_t *)(in_RDX + (long)local_3c * 0x30));
      if ((*(uint *)((long)pvVar3 + (long)local_3c * 0x48 + 0x10) & 1) == 0) {
        pvVar6 = ___kmp_allocate(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *(void **)((long)pvVar3 + (long)local_3c * 0x48 + 0x18) = pvVar6;
        *(long *)((long)pvVar3 + (long)local_3c * 0x48 + 0x20) =
             *(long *)((long)pvVar3 + (long)local_3c * 0x48 + 0x18) + iVar1 * lVar5;
        if (*(long *)((long)pvVar3 + (long)local_3c * 0x48 + 0x30) != 0) {
          for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar1;
              in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
            __kmp_call_init<kmp_task_red_input>
                      ((kmp_taskred_data_t *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
          }
        }
      }
      else {
        pvVar6 = ___kmp_allocate(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *(void **)((long)pvVar3 + (long)local_3c * 0x48 + 0x18) = pvVar6;
      }
    }
    pkVar2->reduce_data = pvVar3;
    pkVar2->reduce_num_data = in_ESI;
  }
  return pkVar2;
}

Assistant:

void *__kmp_task_reduction_init(int gtid, int num, T *data) {
  kmp_info_t *thread = __kmp_threads[gtid];
  kmp_taskgroup_t *tg = thread->th.th_current_task->td_taskgroup;
  kmp_int32 nth = thread->th.th_team_nproc;
  kmp_taskred_data_t *arr;

  // check input data just in case
  KMP_ASSERT(tg != NULL);
  KMP_ASSERT(data != NULL);
  KMP_ASSERT(num > 0);
  if (nth == 1) {
    KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, tg %p, exiting nth=1\n",
                  gtid, tg));
    return (void *)tg;
  }
  KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, taskgroup %p, #items %d\n",
                gtid, tg, num));
  arr = (kmp_taskred_data_t *)__kmp_thread_malloc(
      thread, num * sizeof(kmp_taskred_data_t));
  for (int i = 0; i < num; ++i) {
    size_t size = data[i].reduce_size - 1;
    // round the size up to cache line per thread-specific item
    size += CACHE_LINE - size % CACHE_LINE;
    KMP_ASSERT(data[i].reduce_comb != NULL); // combiner is mandatory
    arr[i].reduce_shar = data[i].reduce_shar;
    arr[i].reduce_size = size;
    arr[i].flags = data[i].flags;
    arr[i].reduce_comb = data[i].reduce_comb;
    arr[i].reduce_init = data[i].reduce_init;
    arr[i].reduce_fini = data[i].reduce_fini;
    __kmp_assign_orig<T>(arr[i], data[i]);
    if (!arr[i].flags.lazy_priv) {
      // allocate cache-line aligned block and fill it with zeros
      arr[i].reduce_priv = __kmp_allocate(nth * size);
      arr[i].reduce_pend = (char *)(arr[i].reduce_priv) + nth * size;
      if (arr[i].reduce_init != NULL) {
        // initialize all thread-specific items
        for (int j = 0; j < nth; ++j) {
          __kmp_call_init<T>(arr[i], j * size);
        }
      }
    } else {
      // only allocate space for pointers now,
      // objects will be lazily allocated/initialized if/when requested
      // note that __kmp_allocate zeroes the allocated memory
      arr[i].reduce_priv = __kmp_allocate(nth * sizeof(void *));
    }
  }
  tg->reduce_data = (void *)arr;
  tg->reduce_num_data = num;
  return (void *)tg;
}